

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaVirtualBlock_T::Allocate
          (VmaVirtualBlock_T *this,VmaVirtualAllocationCreateInfo *createInfo,
          VmaVirtualAllocation *outAllocation,VkDeviceSize *outOffset)

{
  int iVar1;
  VkResult VVar2;
  undefined4 extraout_var;
  VkDeviceSize VVar3;
  VmaVirtualAllocation local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (VmaVirtualAllocation)0x0;
  uStack_50 = 0;
  local_28 = 0;
  iVar1 = (*this->m_Metadata->_vptr_VmaBlockMetadata[0x11])
                    (this->m_Metadata,createInfo->size,
                     createInfo->alignment + (ulong)(createInfo->alignment == 0),
                     (ulong)((createInfo->flags & 0x40) >> 6),1,(ulong)(createInfo->flags & 0x70000)
                     ,&local_58);
  if ((char)iVar1 == '\0') {
    *outAllocation = (VmaVirtualAllocation)0x0;
    VVar3 = 0xffffffffffffffff;
    VVar2 = VK_ERROR_OUT_OF_DEVICE_MEMORY;
    if (outOffset == (VkDeviceSize *)0x0) {
      return VK_ERROR_OUT_OF_DEVICE_MEMORY;
    }
  }
  else {
    (*this->m_Metadata->_vptr_VmaBlockMetadata[0x13])
              (this->m_Metadata,&local_58,1,createInfo->pUserData);
    *outAllocation = local_58;
    if (outOffset == (VkDeviceSize *)0x0) {
      return VK_SUCCESS;
    }
    iVar1 = (*this->m_Metadata->_vptr_VmaBlockMetadata[9])();
    VVar3 = CONCAT44(extraout_var,iVar1);
    VVar2 = VK_SUCCESS;
  }
  *outOffset = VVar3;
  return VVar2;
}

Assistant:

VkResult VmaVirtualBlock_T::Allocate(const VmaVirtualAllocationCreateInfo& createInfo, VmaVirtualAllocation& outAllocation,
    VkDeviceSize* outOffset)
{
    VmaAllocationRequest request = {};
    if (m_Metadata->CreateAllocationRequest(
        createInfo.size, // allocSize
        VMA_MAX(createInfo.alignment, (VkDeviceSize)1), // allocAlignment
        (createInfo.flags & VMA_VIRTUAL_ALLOCATION_CREATE_UPPER_ADDRESS_BIT) != 0, // upperAddress
        VMA_SUBALLOCATION_TYPE_UNKNOWN, // allocType - unimportant
        createInfo.flags & VMA_VIRTUAL_ALLOCATION_CREATE_STRATEGY_MASK, // strategy
        &request))
    {
        m_Metadata->Alloc(request,
            VMA_SUBALLOCATION_TYPE_UNKNOWN, // type - unimportant
            createInfo.pUserData);
        outAllocation = (VmaVirtualAllocation)request.allocHandle;
        if(outOffset)
            *outOffset = m_Metadata->GetAllocationOffset(request.allocHandle);
        return VK_SUCCESS;
    }
    outAllocation = (VmaVirtualAllocation)VK_NULL_HANDLE;
    if (outOffset)
        *outOffset = UINT64_MAX;
    return VK_ERROR_OUT_OF_DEVICE_MEMORY;
}